

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  int iVar1;
  uint nReserve;
  Pager *pPVar2;
  sqlite3_file *psVar3;
  int iVar4;
  Btree *p;
  Pager *pPVar5;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    iVar4 = 1;
    goto LAB_00155da9;
  }
  sqlite3BtreeEnter(p);
  if (op == 0x26) {
    nReserve = *pArg;
    iVar4 = sqlite3BtreeGetRequestedReserve(p);
    *(int *)pArg = iVar4;
    iVar4 = 0;
    if (nReserve < 0x100) {
      iVar4 = 0;
      sqlite3BtreeSetPageSize(p,0,nReserve,0);
    }
  }
  else {
    pPVar2 = p->pBt->pPager;
    pPVar5 = pPVar2;
    if (op == 0x1b) {
LAB_00155d99:
      *(sqlite3_vfs **)pArg = pPVar5->pVfs;
    }
    else {
      if (op == 0x1c) {
        pPVar5 = (Pager *)&pPVar2->jfd;
        if (pPVar2->pWal != (Wal *)0x0) {
          pPVar5 = (Pager *)&pPVar2->pWal->pWalFd;
        }
        goto LAB_00155d99;
      }
      if (op == 0x23) {
        *(u32 *)pArg = pPVar2->iDataVersion;
      }
      else {
        psVar3 = pPVar2->fd;
        if (op != 7) {
          iVar1 = (db->busyHandler).nBusy;
          if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
            iVar4 = 0xc;
          }
          else {
            iVar4 = (*psVar3->pMethods->xFileControl)(psVar3,op,pArg);
          }
          (db->busyHandler).nBusy = iVar1;
          goto LAB_00155da1;
        }
        *(sqlite3_file **)pArg = psVar3;
      }
    }
    iVar4 = 0;
  }
LAB_00155da1:
  sqlite3BtreeLeave(p);
LAB_00155da9:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}